

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_layer.c
# Opt level: O0

void dropout_layer_backward(layer_t *l)

{
  dropout_layer_t *drop;
  int b;
  int i;
  layer_t *l_local;
  
  for (drop._0_4_ = 0; (int)drop < l->n->batch; drop._0_4_ = (int)drop + 1) {
    for (drop._4_4_ = 0; drop._4_4_ < (l->in).size; drop._4_4_ = drop._4_4_ + 1) {
      if (*(float *)&l[1].func <= (l->extra).val[drop._4_4_]) {
        (l->in).grad[(int)drop * (l->in).size + drop._4_4_] =
             (l->out).grad[(int)drop * (l->in).size + drop._4_4_] / (1.0 - *(float *)&l[1].func);
      }
      else {
        (l->in).grad[(int)drop * (l->in).size + drop._4_4_] = 0.0;
      }
    }
  }
  return;
}

Assistant:

static void dropout_layer_backward(layer_t *l)
{
	int i = 0, b = 0;
	dropout_layer_t *drop = (dropout_layer_t *)l;

	for (b = 0; b < l->n->batch; ++b)
		for (i = 0; i < l->in.size; ++i)
		{
			if (l->extra.val[i] < drop->prob)
				l->in.grad[b * l->in.size + i] = 0;
			else
				l->in.grad[b * l->in.size + i] = l->out.grad[b * l->in.size + i] / (1 - drop->prob);
		}
}